

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8.h
# Opt level: O1

void ncnn::conv3x3s1_winograd43_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int iVar10;
  size_t _elemsize;
  int *piVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  Option *opt_00;
  Mat *pMVar44;
  uint uVar45;
  int iVar46;
  int iVar47;
  long lVar48;
  uint uVar49;
  ulong uVar50;
  float *pfVar51;
  float *pfVar52;
  ulong uVar53;
  long lVar54;
  ulong uVar55;
  long lVar56;
  long lVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [12];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 in_ZMM7 [64];
  float fVar92;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 in_ZMM8 [64];
  undefined1 auVar102 [32];
  ulong local_6e0;
  long local_6d8;
  undefined1 local_6d0 [16];
  Mat local_6c0;
  ulong local_678;
  void *local_670;
  long local_668;
  long local_660;
  ulong local_658;
  ulong local_650;
  long local_648;
  ulong local_640;
  int local_638;
  int local_634;
  Mat local_630;
  Option *local_5e0;
  Mat *local_5d8;
  Mat local_5d0;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined8 local_570;
  float afStack_568 [2];
  Allocator *local_560;
  int iStack_558;
  int iStack_554;
  undefined8 uStack_550;
  int local_548;
  size_t local_540;
  undefined8 local_538;
  ulong local_530;
  Mat *local_528;
  size_t local_520;
  Mat *local_518;
  long local_510;
  long local_508;
  long local_500;
  long local_4f8;
  undefined1 local_4f0 [16];
  float afStack_4e0 [48];
  float afStack_420 [48];
  float afStack_360 [96];
  float afStack_1e0 [108];
  
  iVar46 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  iVar10 = bottom_blob->elempack;
  uVar2 = top_blob->w;
  uVar4 = top_blob->h;
  auVar59._4_4_ = uVar4;
  auVar59._0_4_ = uVar2;
  local_634 = top_blob->c;
  piVar11 = bottom_blob->refcount;
  local_630.data = bottom_blob->data;
  local_630.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_630.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_630.elemsize._0_4_ = (undefined4)_elemsize;
  local_630.elemsize._4_4_ = (undefined4)(_elemsize >> 0x20);
  local_630.allocator = bottom_blob->allocator;
  uVar36 = bottom_blob->dims;
  uVar37 = bottom_blob->w;
  uVar38 = bottom_blob->h;
  uVar39 = bottom_blob->d;
  local_630.cstep = bottom_blob->cstep;
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + 1;
    UNLOCK();
  }
  auVar62._8_4_ = 3;
  auVar62._0_8_ = 0x300000003;
  auVar62._12_4_ = 3;
  auVar59._8_8_ = 0;
  auVar59 = vpaddd_avx(auVar59,auVar62);
  auVar63 = vpsrad_avx(auVar59,0x1f);
  auVar63 = vpsrld_avx(auVar63,0x1e);
  local_6d0 = vpaddd_avx(auVar59,auVar63);
  auVar58._8_4_ = 0xfffffffc;
  auVar58._0_8_ = 0xfffffffcfffffffc;
  auVar58._12_4_ = 0xfffffffc;
  local_4f0 = vpand_avx(local_6d0,auVar58);
  local_530 = (ulong)local_4f0._4_4_;
  local_538 = CONCAT44((int)(local_630.cstep >> 0x20),local_4f0._0_4_);
  auVar63 = local_6d0;
  local_630.elempack = iVar10;
  local_630.dims = uVar36;
  local_630.w = uVar37;
  local_630.h = uVar38;
  local_630.d = uVar39;
  local_630.c = iVar46;
  local_528 = bias;
  local_518 = kernel_tm;
  copy_make_border(bottom_blob,&local_630,0,(local_4f0._4_4_ + 2) - bottom_blob->h,0,
                   (local_4f0._0_4_ + 2) - bottom_blob->w,0,0.0,opt);
  auVar59 = vpsrad_avx(local_6d0,2);
  local_5d0.cstep = 0;
  local_5d0.data = (void *)0x0;
  local_5d0.refcount._0_4_ = 0;
  local_5d0.refcount._4_4_ = 0;
  local_5d0.elemsize._0_4_ = 0;
  local_5d0.elemsize._4_4_ = 0;
  local_5d0.elempack = 0;
  local_5d0.allocator = (Allocator *)0x0;
  local_5d0.dims = 0;
  local_5d0.w = 0;
  local_5d0.h = 0;
  local_5d0.d = 0;
  local_5d0.c = 0;
  local_638 = iVar10;
  local_5e0 = opt;
  local_5d8 = top_blob;
  local_520 = _elemsize;
  Mat::create(&local_5d0,auVar59._4_4_ * auVar59._0_4_,0x24,iVar46,_elemsize,iVar10,
              opt->workspace_allocator);
  pMVar44 = local_5d8;
  opt_00 = local_5e0;
  iVar10 = local_634;
  iVar46 = local_638;
  local_668 = (long)local_630.c;
  if (0 < local_668) {
    local_650 = (ulong)(uint)local_630.w;
    local_670 = (void *)(ulong)(uint)local_630.h;
    iVar47 = local_630.h + 1;
    if (-1 < (int)(local_630.h - 2U)) {
      iVar47 = local_630.h - 2U;
    }
    uVar49 = iVar47 >> 2;
    iVar47 = local_630.w + 1;
    if (-1 < (int)(local_630.w - 2U)) {
      iVar47 = local_630.w - 2U;
    }
    uVar45 = iVar47 >> 2;
    iVar47 = uVar45 * uVar49;
    uVar55 = 1;
    if (1 < (int)uVar45) {
      uVar55 = (ulong)uVar45;
    }
    if ((int)uVar49 < 2) {
      uVar49 = 1;
    }
    local_658 = (ulong)uVar49;
    local_660 = (long)(int)uVar45 * 0x20;
    local_678 = (long)(iVar47 * 8) * 4;
    local_4f8 = (long)(iVar47 * 0x10) * 4;
    local_500 = (long)(iVar47 * 0x18) * 4;
    local_510 = (long)(iVar47 * 0x28) * 4;
    local_508 = (long)(iVar47 * 0x20) * 4;
    local_6d8 = 0;
    auVar63._8_4_ = 0xc0a00000;
    auVar63._0_8_ = 0xc0a00000c0a00000;
    auVar63._12_4_ = 0xc0a00000;
    do {
      if (5 < local_630.h) {
        lVar48 = (long)local_630.w *
                 CONCAT44(local_630.elemsize._4_4_,(undefined4)local_630.elemsize);
        local_648 = lVar48 * 4;
        lVar54 = CONCAT44(local_5d0.elemsize._4_4_,(undefined4)local_5d0.elemsize) * local_5d0.cstep
                 * local_6d8;
        local_6d0._0_8_ =
             (long)local_630.data +
             CONCAT44(local_630.elemsize._4_4_,(undefined4)local_630.elemsize) * local_630.cstep *
             local_6d8 + 0xa0;
        local_6e0 = 0;
        uVar50 = 0;
        do {
          local_640 = uVar50;
          if (5 < local_630.w) {
            uVar53 = 0;
            uVar50 = local_6e0;
            pfVar52 = (float *)local_6d0._0_8_;
            do {
              lVar56 = -0xc0;
              pfVar51 = pfVar52;
              do {
                auVar6 = *(undefined1 (*) [32])(pfVar51 + -0x20);
                auVar7 = *(undefined1 (*) [32])(pfVar51 + -0x18);
                auVar8 = *(undefined1 (*) [32])(pfVar51 + -0x10);
                auVar9 = *(undefined1 (*) [32])(pfVar51 + -8);
                auVar83._0_4_ = auVar7._0_4_ * -5.0 + pfVar51[-0x28] * 4.0 + auVar9._0_4_;
                auVar83._4_4_ = auVar7._4_4_ * -5.0 + pfVar51[-0x27] * 4.0 + auVar9._4_4_;
                auVar83._8_4_ = auVar7._8_4_ * -5.0 + pfVar51[-0x26] * 4.0 + auVar9._8_4_;
                auVar83._12_4_ = auVar7._12_4_ * -5.0 + pfVar51[-0x25] * 4.0 + auVar9._12_4_;
                auVar83._16_4_ = auVar7._16_4_ * -5.0 + pfVar51[-0x24] * 4.0 + auVar9._16_4_;
                auVar83._20_4_ = auVar7._20_4_ * -5.0 + pfVar51[-0x23] * 4.0 + auVar9._20_4_;
                auVar83._24_4_ = auVar7._24_4_ * -5.0 + pfVar51[-0x22] * 4.0 + auVar9._24_4_;
                auVar83._28_4_ = in_ZMM8._28_4_ + in_ZMM7._28_4_ + auVar9._28_4_;
                in_ZMM7 = ZEXT3264(auVar83);
                auVar93._0_4_ = auVar9._0_4_ + auVar8._0_4_ + (auVar7._0_4_ + auVar6._0_4_) * -4.0;
                auVar93._4_4_ = auVar9._4_4_ + auVar8._4_4_ + (auVar7._4_4_ + auVar6._4_4_) * -4.0;
                auVar93._8_4_ = auVar9._8_4_ + auVar8._8_4_ + (auVar7._8_4_ + auVar6._8_4_) * -4.0;
                auVar93._12_4_ =
                     auVar9._12_4_ + auVar8._12_4_ + (auVar7._12_4_ + auVar6._12_4_) * -4.0;
                auVar93._16_4_ =
                     auVar9._16_4_ + auVar8._16_4_ + (auVar7._16_4_ + auVar6._16_4_) * -4.0;
                auVar93._20_4_ =
                     auVar9._20_4_ + auVar8._20_4_ + (auVar7._20_4_ + auVar6._20_4_) * -4.0;
                auVar93._24_4_ =
                     auVar9._24_4_ + auVar8._24_4_ + (auVar7._24_4_ + auVar6._24_4_) * -4.0;
                auVar93._28_4_ = auVar9._28_4_ + auVar8._28_4_ + auVar7._28_4_ + auVar6._28_4_;
                in_ZMM8 = ZEXT3264(auVar93);
                auVar20 = vsubps_avx(auVar6,auVar7);
                auVar81 = vsubps_avx(auVar9,auVar8);
                auVar84 = vsubps_avx(auVar6,auVar8);
                auVar7 = vsubps_avx(auVar9,auVar7);
                auVar80._0_4_ = auVar84._0_4_ + auVar84._0_4_;
                auVar80._4_4_ = auVar84._4_4_ + auVar84._4_4_;
                auVar80._8_4_ = auVar84._8_4_ + auVar84._8_4_;
                auVar80._12_4_ = auVar84._12_4_ + auVar84._12_4_;
                auVar80._16_4_ = auVar84._16_4_ + auVar84._16_4_;
                auVar80._20_4_ = auVar84._20_4_ + auVar84._20_4_;
                auVar80._24_4_ = auVar84._24_4_ + auVar84._24_4_;
                auVar80._28_4_ = auVar84._28_4_ + auVar84._28_4_;
                auVar9 = vsubps_avx(auVar7,auVar80);
                fVar66 = *pfVar51;
                fVar67 = pfVar51[1];
                fVar64 = pfVar51[2];
                fVar65 = pfVar51[3];
                fVar68 = pfVar51[4];
                fVar69 = pfVar51[5];
                fVar70 = pfVar51[6];
                fVar71 = pfVar51[7];
                *(undefined1 (*) [32])((long)afStack_420 + lVar56) = auVar83;
                *(undefined1 (*) [32])((long)afStack_360 + lVar56) = auVar93;
                *(float *)((long)afStack_360 + lVar56 + 0xc0) = auVar81._0_4_ + auVar20._0_4_ * 4.0;
                *(float *)((long)afStack_360 + lVar56 + 0xc4) = auVar81._4_4_ + auVar20._4_4_ * 4.0;
                *(float *)((long)afStack_360 + lVar56 + 200) = auVar81._8_4_ + auVar20._8_4_ * 4.0;
                *(float *)((long)afStack_360 + lVar56 + 0xcc) =
                     auVar81._12_4_ + auVar20._12_4_ * 4.0;
                *(float *)((long)afStack_360 + lVar56 + 0xd0) =
                     auVar81._16_4_ + auVar20._16_4_ * 4.0;
                *(float *)((long)afStack_360 + lVar56 + 0xd4) =
                     auVar81._20_4_ + auVar20._20_4_ * 4.0;
                *(float *)((long)afStack_360 + lVar56 + 0xd8) =
                     auVar81._24_4_ + auVar20._24_4_ * 4.0;
                *(float *)((long)afStack_360 + lVar56 + 0xdc) = auVar81._28_4_ + auVar20._28_4_;
                *(undefined1 (*) [32])((long)afStack_1e0 + lVar56) = auVar9;
                *(float *)((long)afStack_1e0 + lVar56 + 0xc0) = auVar80._0_4_ + auVar7._0_4_;
                *(float *)((long)afStack_1e0 + lVar56 + 0xc4) = auVar80._4_4_ + auVar7._4_4_;
                *(float *)((long)afStack_1e0 + lVar56 + 200) = auVar80._8_4_ + auVar7._8_4_;
                *(float *)((long)afStack_1e0 + lVar56 + 0xcc) = auVar80._12_4_ + auVar7._12_4_;
                *(float *)((long)afStack_1e0 + lVar56 + 0xd0) = auVar80._16_4_ + auVar7._16_4_;
                *(float *)((long)afStack_1e0 + lVar56 + 0xd4) = auVar80._20_4_ + auVar7._20_4_;
                *(float *)((long)afStack_1e0 + lVar56 + 0xd8) = auVar80._24_4_ + auVar7._24_4_;
                *(float *)((long)afStack_1e0 + lVar56 + 0xdc) = auVar80._28_4_ + auVar7._28_4_;
                *(float *)((long)afStack_1e0 + lVar56 + 0x180) =
                     auVar8._0_4_ * -5.0 + auVar6._0_4_ * 4.0 + fVar66;
                *(float *)((long)afStack_1e0 + lVar56 + 0x184) =
                     auVar8._4_4_ * -5.0 + auVar6._4_4_ * 4.0 + fVar67;
                *(float *)((long)afStack_1e0 + lVar56 + 0x188) =
                     auVar8._8_4_ * -5.0 + auVar6._8_4_ * 4.0 + fVar64;
                *(float *)((long)afStack_1e0 + lVar56 + 0x18c) =
                     auVar8._12_4_ * -5.0 + auVar6._12_4_ * 4.0 + fVar65;
                *(float *)((long)afStack_1e0 + lVar56 + 400) =
                     auVar8._16_4_ * -5.0 + auVar6._16_4_ * 4.0 + fVar68;
                *(float *)((long)afStack_1e0 + lVar56 + 0x194) =
                     auVar8._20_4_ * -5.0 + auVar6._20_4_ * 4.0 + fVar69;
                *(float *)((long)afStack_1e0 + lVar56 + 0x198) =
                     auVar8._24_4_ * -5.0 + auVar6._24_4_ * 4.0 + fVar70;
                *(float *)((long)afStack_1e0 + lVar56 + 0x19c) =
                     auVar8._28_4_ + auVar6._28_4_ + fVar71;
                pfVar51 = pfVar51 + local_630.w * 8;
                lVar56 = lVar56 + 0x20;
              } while (lVar56 != 0);
              lVar57 = 0xa0;
              lVar56 = uVar50;
              do {
                auVar6 = *(undefined1 (*) [32])((long)&local_560 + lVar57);
                auVar7 = *(undefined1 (*) [32])((long)&local_540 + lVar57);
                auVar8 = *(undefined1 (*) [32])((long)&local_520 + lVar57);
                auVar9 = *(undefined1 (*) [32])((long)&local_500 + lVar57);
                auVar84._0_4_ =
                     auVar7._0_4_ * -5.0 + *(float *)(local_580 + lVar57) * 4.0 + auVar9._0_4_;
                auVar84._4_4_ =
                     auVar7._4_4_ * -5.0 + *(float *)(local_580 + lVar57 + 4) * 4.0 + auVar9._4_4_;
                auVar84._8_4_ =
                     auVar7._8_4_ * -5.0 + *(float *)((long)&fStack_578 + lVar57) * 4.0 +
                     auVar9._8_4_;
                auVar84._12_4_ =
                     auVar7._12_4_ * -5.0 + *(float *)((long)&fStack_574 + lVar57) * 4.0 +
                     auVar9._12_4_;
                auVar84._16_4_ =
                     auVar7._16_4_ * -5.0 + *(float *)((long)&local_570 + lVar57) * 4.0 +
                     auVar9._16_4_;
                auVar84._20_4_ =
                     auVar7._20_4_ * -5.0 + *(float *)((long)&local_570 + lVar57 + 4) * 4.0 +
                     auVar9._20_4_;
                auVar84._24_4_ =
                     auVar7._24_4_ * -5.0 + *(float *)((long)afStack_568 + lVar57) * 4.0 +
                     auVar9._24_4_;
                auVar84._28_4_ = in_ZMM8._28_4_ + in_ZMM7._28_4_ + auVar9._28_4_;
                in_ZMM7 = ZEXT3264(auVar84);
                auVar94._0_4_ = auVar9._0_4_ + auVar8._0_4_ + (auVar7._0_4_ + auVar6._0_4_) * -4.0;
                auVar94._4_4_ = auVar9._4_4_ + auVar8._4_4_ + (auVar7._4_4_ + auVar6._4_4_) * -4.0;
                auVar94._8_4_ = auVar9._8_4_ + auVar8._8_4_ + (auVar7._8_4_ + auVar6._8_4_) * -4.0;
                auVar94._12_4_ =
                     auVar9._12_4_ + auVar8._12_4_ + (auVar7._12_4_ + auVar6._12_4_) * -4.0;
                auVar94._16_4_ =
                     auVar9._16_4_ + auVar8._16_4_ + (auVar7._16_4_ + auVar6._16_4_) * -4.0;
                auVar94._20_4_ =
                     auVar9._20_4_ + auVar8._20_4_ + (auVar7._20_4_ + auVar6._20_4_) * -4.0;
                auVar94._24_4_ =
                     auVar9._24_4_ + auVar8._24_4_ + (auVar7._24_4_ + auVar6._24_4_) * -4.0;
                auVar94._28_4_ = auVar9._28_4_ + auVar8._28_4_ + auVar7._28_4_ + auVar6._28_4_;
                in_ZMM8 = ZEXT3264(auVar94);
                auVar20 = vsubps_avx(auVar6,auVar7);
                auVar81 = vsubps_avx(auVar9,auVar8);
                auVar102._0_4_ = auVar81._0_4_ + auVar20._0_4_ * 4.0;
                auVar102._4_4_ = auVar81._4_4_ + auVar20._4_4_ * 4.0;
                auVar102._8_4_ = auVar81._8_4_ + auVar20._8_4_ * 4.0;
                auVar102._12_4_ = auVar81._12_4_ + auVar20._12_4_ * 4.0;
                auVar102._16_4_ = auVar81._16_4_ + auVar20._16_4_ * 4.0;
                auVar102._20_4_ = auVar81._20_4_ + auVar20._20_4_ * 4.0;
                auVar102._24_4_ = auVar81._24_4_ + auVar20._24_4_ * 4.0;
                auVar102._28_4_ = auVar81._28_4_ + auVar20._28_4_;
                auVar20 = vsubps_avx(auVar6,auVar8);
                auVar7 = vsubps_avx(auVar9,auVar7);
                auVar81._0_4_ = auVar20._0_4_ + auVar20._0_4_;
                auVar81._4_4_ = auVar20._4_4_ + auVar20._4_4_;
                auVar81._8_4_ = auVar20._8_4_ + auVar20._8_4_;
                auVar81._12_4_ = auVar20._12_4_ + auVar20._12_4_;
                auVar81._16_4_ = auVar20._16_4_ + auVar20._16_4_;
                auVar81._20_4_ = auVar20._20_4_ + auVar20._20_4_;
                auVar81._24_4_ = auVar20._24_4_ + auVar20._24_4_;
                auVar81._28_4_ = auVar20._28_4_ + auVar20._28_4_;
                auVar9 = vsubps_avx(auVar7,auVar81);
                fVar66 = *(float *)((long)afStack_4e0 + lVar57);
                fVar67 = *(float *)((long)afStack_4e0 + lVar57 + 4);
                fVar64 = *(float *)((long)afStack_4e0 + lVar57 + 8);
                fVar65 = *(float *)((long)afStack_4e0 + lVar57 + 0xc);
                fVar68 = *(float *)((long)afStack_4e0 + lVar57 + 0x10);
                fVar69 = *(float *)((long)afStack_4e0 + lVar57 + 0x14);
                fVar70 = *(float *)((long)afStack_4e0 + lVar57 + 0x18);
                fVar71 = *(float *)((long)afStack_4e0 + lVar57 + 0x1c);
                *(undefined1 (*) [32])((long)local_5d0.data + lVar56 + lVar54) = auVar84;
                *(undefined1 (*) [32])((long)local_5d0.data + lVar56 + local_678 + lVar54) = auVar94
                ;
                *(undefined1 (*) [32])((long)local_5d0.data + lVar56 + local_4f8 + lVar54) =
                     auVar102;
                *(undefined1 (*) [32])((long)local_5d0.data + lVar56 + local_500 + lVar54) = auVar9;
                pfVar51 = (float *)((long)local_5d0.data + lVar56 + local_508 + lVar54);
                *pfVar51 = auVar81._0_4_ + auVar7._0_4_;
                pfVar51[1] = auVar81._4_4_ + auVar7._4_4_;
                pfVar51[2] = auVar81._8_4_ + auVar7._8_4_;
                pfVar51[3] = auVar81._12_4_ + auVar7._12_4_;
                pfVar51[4] = auVar81._16_4_ + auVar7._16_4_;
                pfVar51[5] = auVar81._20_4_ + auVar7._20_4_;
                pfVar51[6] = auVar81._24_4_ + auVar7._24_4_;
                pfVar51[7] = auVar81._28_4_ + auVar7._28_4_;
                pfVar51 = (float *)((long)local_5d0.data + lVar56 + local_510 + lVar54);
                *pfVar51 = auVar8._0_4_ * -5.0 + auVar6._0_4_ * 4.0 + fVar66;
                pfVar51[1] = auVar8._4_4_ * -5.0 + auVar6._4_4_ * 4.0 + fVar67;
                pfVar51[2] = auVar8._8_4_ * -5.0 + auVar6._8_4_ * 4.0 + fVar64;
                pfVar51[3] = auVar8._12_4_ * -5.0 + auVar6._12_4_ * 4.0 + fVar65;
                pfVar51[4] = auVar8._16_4_ * -5.0 + auVar6._16_4_ * 4.0 + fVar68;
                pfVar51[5] = auVar8._20_4_ * -5.0 + auVar6._20_4_ * 4.0 + fVar69;
                pfVar51[6] = auVar8._24_4_ * -5.0 + auVar6._24_4_ * 4.0 + fVar70;
                pfVar51[7] = auVar8._28_4_ + auVar6._28_4_ + fVar71;
                lVar57 = lVar57 + 0xc0;
                lVar56 = lVar56 + (long)(iVar47 * 0x30) * 4;
              } while (lVar57 != 0x520);
              uVar53 = uVar53 + 1;
              pfVar52 = pfVar52 + 0x20;
              uVar50 = uVar50 + 0x20;
            } while (uVar53 != uVar55);
          }
          local_6d0._0_8_ = (float *)(local_6d0._0_8_ + lVar48 * 4);
          local_6e0 = local_6e0 + local_660;
          uVar50 = local_640 + 1;
        } while (local_640 + 1 != local_658);
      }
      local_6d8 = local_6d8 + 1;
    } while (local_6d8 != local_668);
  }
  piVar11 = (int *)CONCAT44(local_630.refcount._4_4_,local_630.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_630.allocator == (Allocator *)0x0) {
        if (local_630.data != (void *)0x0) {
          free(local_630.data);
        }
      }
      else {
        (*(local_630.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_630.cstep = 0;
  local_630.data = (void *)0x0;
  local_630.refcount._0_4_ = 0;
  local_630.refcount._4_4_ = 0;
  local_630.elemsize._0_4_ = 0;
  local_630.elemsize._4_4_ = 0;
  local_630.elempack = 0;
  local_630.h = 0;
  local_630.d = 0;
  local_630.c = 0;
  local_630.allocator = (Allocator *)0x0;
  local_630.dims = 0;
  local_630.w = 0;
  local_540 = 0;
  local_580 = (undefined1  [8])0x0;
  fStack_578 = 0.0;
  fStack_574 = 0.0;
  local_570 = 0;
  afStack_568[0] = 0.0;
  local_560 = (Allocator *)0x0;
  iStack_558 = 0;
  iStack_554 = 0;
  uStack_550._0_4_ = 0;
  uStack_550._4_4_ = 0;
  local_548 = 0;
  convolution_winograd_dot_pack8_avx(&local_5d0,iVar10,local_518,(Mat *)local_580,opt_00);
  local_6c0.cstep = 0;
  local_6c0.data = (void *)0x0;
  local_6c0.refcount._0_4_ = 0;
  local_6c0.refcount._4_4_ = 0;
  local_6c0.elemsize._0_4_ = 0;
  local_6c0.elemsize._4_4_ = 0;
  local_6c0.elempack = 0;
  local_6c0.allocator = (Allocator *)0x0;
  local_6c0.dims = 0;
  local_6c0.w = 0;
  local_6c0.h = 0;
  local_6c0.d = 0;
  local_6c0.c = 0;
  uVar3 = pMVar44->w;
  uVar5 = pMVar44->h;
  auVar60._4_4_ = uVar5;
  auVar60._0_4_ = uVar3;
  auVar60._8_8_ = 0;
  auVar59 = vpcmpeqd_avx(auVar60,local_4f0);
  auVar58 = vpmovsxdq_avx(auVar59);
  auVar59 = vpcmpeqd_avx(auVar63,auVar63);
  if (((auVar59 & ~auVar58) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
      -1 < SUB161(auVar59 & ~auVar58,0xf)) {
    if (&local_6c0 != pMVar44) {
      piVar11 = pMVar44->refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      local_6c0.data = pMVar44->data;
      local_6c0.refcount._0_4_ = SUB84(pMVar44->refcount,0);
      local_6c0.refcount._4_4_ = (undefined4)((ulong)pMVar44->refcount >> 0x20);
      local_6c0.elemsize._0_4_ = (undefined4)pMVar44->elemsize;
      local_6c0.elemsize._4_4_ = (undefined4)(pMVar44->elemsize >> 0x20);
      local_6c0.elempack = pMVar44->elempack;
      local_6c0.allocator = pMVar44->allocator;
      uVar40 = pMVar44->dims;
      uVar41 = pMVar44->w;
      uVar42 = pMVar44->h;
      uVar43 = pMVar44->d;
      local_6c0.c = pMVar44->c;
      local_6c0.cstep = pMVar44->cstep;
      local_6c0.dims = uVar40;
      local_6c0.w = uVar41;
      local_6c0.h = uVar42;
      local_6c0.d = uVar43;
    }
  }
  else {
    Mat::create(&local_6c0,(int)local_538,(int)local_530,iVar10,local_520,iVar46,
                opt_00->workspace_allocator);
  }
  local_668 = (long)local_6c0.c;
  if (0 < local_668) {
    local_670 = local_528->data;
    local_678 = (ulong)(uint)local_6c0.h;
    uVar49 = local_6c0.h + 3;
    if (-1 < local_6c0.h) {
      uVar49 = local_6c0.h;
    }
    local_658 = (ulong)(uint)local_6c0.w;
    local_650 = (ulong)(uint)((int)uVar49 >> 2);
    uVar45 = local_6c0.w + 3;
    if (-1 < local_6c0.w) {
      uVar45 = local_6c0.w;
    }
    uVar45 = (int)uVar45 >> 2;
    iVar46 = uVar45 * ((int)uVar49 >> 2);
    local_660 = (ulong)uVar45 * 8;
    lVar48 = 0;
    do {
      if (local_670 == (void *)0x0) {
        fVar66 = 0.0;
        fVar67 = 0.0;
        fVar64 = 0.0;
        fVar65 = 0.0;
        fVar68 = 0.0;
        fVar69 = 0.0;
        fVar70 = 0.0;
        fVar71 = 0.0;
      }
      else {
        pfVar52 = (float *)((long)local_670 + lVar48 * 0x20);
        fVar64 = *pfVar52;
        fVar65 = pfVar52[1];
        fVar66 = pfVar52[2];
        fVar67 = pfVar52[3];
        fVar68 = pfVar52[4];
        fVar69 = pfVar52[5];
        fVar70 = pfVar52[6];
        fVar71 = pfVar52[7];
      }
      if (3 < local_6c0.h) {
        lVar54 = (long)local_6c0.w *
                 CONCAT44(local_6c0.elemsize._4_4_,(undefined4)local_6c0.elemsize);
        local_648 = lVar54 * 4;
        local_6d0._0_8_ =
             (long)local_6c0.data +
             CONCAT44(local_6c0.elemsize._4_4_,(undefined4)local_6c0.elemsize) * local_6c0.cstep *
             lVar48 + 0x60;
        local_6e0 = 0;
        uVar55 = 0;
        do {
          local_640 = uVar55;
          if (3 < local_6c0.w) {
            uVar50 = 0;
            uVar55 = local_6e0;
            pfVar52 = (float *)local_6d0._0_8_;
            do {
              pfVar51 = (float *)((long)local_580 +
                                 (uVar55 >> 3 & 0x1fffffff) * 0x20 + local_570 * local_540 * lVar48)
              ;
              lVar56 = -0xc0;
              do {
                auVar6 = *(undefined1 (*) [32])(pfVar51 + iVar46 * 8);
                auVar7 = *(undefined1 (*) [32])(pfVar51 + iVar46 * 0x10);
                auVar8 = *(undefined1 (*) [32])(pfVar51 + iVar46 * 0x18);
                auVar9 = *(undefined1 (*) [32])(pfVar51 + iVar46 * 0x20);
                fVar82 = auVar7._0_4_ + auVar6._0_4_;
                fVar85 = auVar7._4_4_ + auVar6._4_4_;
                fVar86 = auVar7._8_4_ + auVar6._8_4_;
                fVar87 = auVar7._12_4_ + auVar6._12_4_;
                fVar88 = auVar7._16_4_ + auVar6._16_4_;
                fVar89 = auVar7._20_4_ + auVar6._20_4_;
                fVar90 = auVar7._24_4_ + auVar6._24_4_;
                fVar91 = auVar7._28_4_ + auVar6._28_4_;
                auVar6 = vsubps_avx(auVar6,auVar7);
                fVar72 = auVar9._0_4_ + auVar8._0_4_;
                fVar73 = auVar9._4_4_ + auVar8._4_4_;
                fVar74 = auVar9._8_4_ + auVar8._8_4_;
                fVar75 = auVar9._12_4_ + auVar8._12_4_;
                fVar76 = auVar9._16_4_ + auVar8._16_4_;
                fVar77 = auVar9._20_4_ + auVar8._20_4_;
                fVar78 = auVar9._24_4_ + auVar8._24_4_;
                fVar79 = auVar9._28_4_ + auVar8._28_4_;
                fVar21 = pfVar51[1];
                fVar22 = pfVar51[2];
                fVar23 = pfVar51[3];
                fVar24 = pfVar51[4];
                fVar25 = pfVar51[5];
                fVar26 = pfVar51[6];
                fVar27 = pfVar51[7];
                auVar7 = vsubps_avx(auVar8,auVar9);
                fVar12 = auVar7._0_4_;
                fVar13 = auVar7._4_4_;
                fVar14 = auVar7._8_4_;
                fVar15 = auVar7._12_4_;
                fVar16 = auVar7._16_4_;
                fVar17 = auVar7._20_4_;
                fVar18 = auVar7._24_4_;
                fVar19 = auVar7._28_4_;
                pfVar1 = pfVar51 + iVar46 * 0x28;
                fVar28 = *pfVar1;
                fVar29 = pfVar1[1];
                fVar30 = pfVar1[2];
                fVar31 = pfVar1[3];
                fVar32 = pfVar1[4];
                fVar33 = pfVar1[5];
                fVar34 = pfVar1[6];
                fVar35 = pfVar1[7];
                *(float *)((long)afStack_420 + lVar56) = fVar82 + *pfVar51 + fVar72;
                *(float *)((long)afStack_420 + lVar56 + 4) = fVar85 + fVar21 + fVar73;
                *(float *)((long)afStack_420 + lVar56 + 8) = fVar86 + fVar22 + fVar74;
                *(float *)((long)afStack_420 + lVar56 + 0xc) = fVar87 + fVar23 + fVar75;
                *(float *)((long)afStack_420 + lVar56 + 0x10) = fVar88 + fVar24 + fVar76;
                *(float *)((long)afStack_420 + lVar56 + 0x14) = fVar89 + fVar25 + fVar77;
                *(float *)((long)afStack_420 + lVar56 + 0x18) = fVar90 + fVar26 + fVar78;
                *(float *)((long)afStack_420 + lVar56 + 0x1c) = fVar91 + fVar27 + fVar79;
                *(float *)((long)afStack_360 + lVar56) = fVar12 + fVar12 + auVar6._0_4_;
                *(float *)((long)afStack_360 + lVar56 + 4) = fVar13 + fVar13 + auVar6._4_4_;
                *(float *)((long)afStack_360 + lVar56 + 8) = fVar14 + fVar14 + auVar6._8_4_;
                *(float *)((long)afStack_360 + lVar56 + 0xc) = fVar15 + fVar15 + auVar6._12_4_;
                *(float *)((long)afStack_360 + lVar56 + 0x10) = fVar16 + fVar16 + auVar6._16_4_;
                *(float *)((long)afStack_360 + lVar56 + 0x14) = fVar17 + fVar17 + auVar6._20_4_;
                *(float *)((long)afStack_360 + lVar56 + 0x18) = fVar18 + fVar18 + auVar6._24_4_;
                *(float *)((long)afStack_360 + lVar56 + 0x1c) = fVar19 + fVar19 + auVar6._28_4_;
                *(float *)((long)afStack_360 + lVar56 + 0xc0) = fVar72 * 4.0 + fVar82;
                *(float *)((long)afStack_360 + lVar56 + 0xc4) = fVar73 * 4.0 + fVar85;
                *(float *)((long)afStack_360 + lVar56 + 200) = fVar74 * 4.0 + fVar86;
                *(float *)((long)afStack_360 + lVar56 + 0xcc) = fVar75 * 4.0 + fVar87;
                *(float *)((long)afStack_360 + lVar56 + 0xd0) = fVar76 * 4.0 + fVar88;
                *(float *)((long)afStack_360 + lVar56 + 0xd4) = fVar77 * 4.0 + fVar89;
                *(float *)((long)afStack_360 + lVar56 + 0xd8) = fVar78 * 4.0 + fVar90;
                *(float *)((long)afStack_360 + lVar56 + 0xdc) = fVar79 + fVar91;
                *(float *)((long)afStack_1e0 + lVar56) = auVar6._0_4_ + fVar28 + fVar12 * 8.0;
                *(float *)((long)afStack_1e0 + lVar56 + 4) = auVar6._4_4_ + fVar29 + fVar13 * 8.0;
                *(float *)((long)afStack_1e0 + lVar56 + 8) = auVar6._8_4_ + fVar30 + fVar14 * 8.0;
                *(float *)((long)afStack_1e0 + lVar56 + 0xc) = auVar6._12_4_ + fVar31 + fVar15 * 8.0
                ;
                *(float *)((long)afStack_1e0 + lVar56 + 0x10) =
                     auVar6._16_4_ + fVar32 + fVar16 * 8.0;
                *(float *)((long)afStack_1e0 + lVar56 + 0x14) =
                     auVar6._20_4_ + fVar33 + fVar17 * 8.0;
                *(float *)((long)afStack_1e0 + lVar56 + 0x18) =
                     auVar6._24_4_ + fVar34 + fVar18 * 8.0;
                *(float *)((long)afStack_1e0 + lVar56 + 0x1c) = auVar6._28_4_ + fVar35 + fVar19;
                pfVar51 = pfVar51 + iVar46 * 0x30;
                lVar56 = lVar56 + 0x20;
              } while (lVar56 != 0);
              lVar56 = 0xa0;
              pfVar51 = pfVar52;
              do {
                auVar6 = *(undefined1 (*) [32])((long)&local_560 + lVar56);
                auVar7 = *(undefined1 (*) [32])((long)&local_540 + lVar56);
                auVar8 = *(undefined1 (*) [32])((long)&local_520 + lVar56);
                auVar9 = *(undefined1 (*) [32])((long)&local_500 + lVar56);
                auVar20 = vsubps_avx(auVar6,auVar7);
                fVar92 = auVar9._0_4_ + auVar8._0_4_;
                fVar95 = auVar9._4_4_ + auVar8._4_4_;
                fVar96 = auVar9._8_4_ + auVar8._8_4_;
                fVar97 = auVar9._12_4_ + auVar8._12_4_;
                fVar98 = auVar9._16_4_ + auVar8._16_4_;
                fVar99 = auVar9._20_4_ + auVar8._20_4_;
                fVar100 = auVar9._24_4_ + auVar8._24_4_;
                fVar101 = auVar9._28_4_ + auVar8._28_4_;
                auVar8 = vsubps_avx(auVar8,auVar9);
                fVar72 = auVar6._0_4_ + fVar64 + auVar7._0_4_;
                fVar73 = auVar6._4_4_ + fVar65 + auVar7._4_4_;
                fVar74 = auVar6._8_4_ + fVar66 + auVar7._8_4_;
                fVar75 = auVar6._12_4_ + fVar67 + auVar7._12_4_;
                fVar76 = auVar6._16_4_ + fVar68 + auVar7._16_4_;
                fVar77 = auVar6._20_4_ + fVar69 + auVar7._20_4_;
                fVar78 = auVar6._24_4_ + fVar70 + auVar7._24_4_;
                fVar79 = auVar6._28_4_ + fVar71 + auVar7._28_4_;
                fVar21 = *(float *)(local_580 + lVar56 + 4);
                fVar22 = *(float *)((long)&fStack_578 + lVar56);
                fVar23 = *(float *)((long)&fStack_574 + lVar56);
                fVar24 = *(float *)((long)&local_570 + lVar56);
                fVar25 = *(float *)((long)&local_570 + lVar56 + 4);
                fVar26 = *(float *)((long)afStack_568 + lVar56);
                fVar27 = *(float *)((long)afStack_568 + lVar56 + 4);
                fVar12 = auVar8._0_4_;
                fVar13 = auVar8._4_4_;
                fVar14 = auVar8._8_4_;
                fVar15 = auVar8._12_4_;
                fVar16 = auVar8._16_4_;
                fVar17 = auVar8._20_4_;
                fVar18 = auVar8._24_4_;
                fVar19 = auVar8._28_4_;
                fVar82 = auVar20._0_4_ + fVar64;
                fVar85 = auVar20._4_4_ + fVar65;
                fVar86 = auVar20._8_4_ + fVar66;
                fVar87 = auVar20._12_4_ + fVar67;
                fVar88 = auVar20._16_4_ + fVar68;
                fVar89 = auVar20._20_4_ + fVar69;
                fVar90 = auVar20._24_4_ + fVar70;
                fVar91 = auVar20._28_4_ + fVar71;
                fVar28 = *(float *)((long)afStack_4e0 + lVar56);
                fVar29 = *(float *)((long)afStack_4e0 + lVar56 + 4);
                fVar30 = *(float *)((long)afStack_4e0 + lVar56 + 8);
                fVar31 = *(float *)((long)afStack_4e0 + lVar56 + 0xc);
                fVar32 = *(float *)((long)afStack_4e0 + lVar56 + 0x10);
                fVar33 = *(float *)((long)afStack_4e0 + lVar56 + 0x14);
                fVar34 = *(float *)((long)afStack_4e0 + lVar56 + 0x18);
                fVar35 = *(float *)((long)afStack_4e0 + lVar56 + 0x1c);
                pfVar51[-0x18] = fVar92 + fVar72 + *(float *)(local_580 + lVar56);
                pfVar51[-0x17] = fVar95 + fVar73 + fVar21;
                pfVar51[-0x16] = fVar96 + fVar74 + fVar22;
                pfVar51[-0x15] = fVar97 + fVar75 + fVar23;
                pfVar51[-0x14] = fVar98 + fVar76 + fVar24;
                pfVar51[-0x13] = fVar99 + fVar77 + fVar25;
                pfVar51[-0x12] = fVar100 + fVar78 + fVar26;
                pfVar51[-0x11] = fVar101 + fVar79 + fVar27;
                pfVar51[-0x10] = fVar12 + fVar12 + fVar82;
                pfVar51[-0xf] = fVar13 + fVar13 + fVar85;
                pfVar51[-0xe] = fVar14 + fVar14 + fVar86;
                pfVar51[-0xd] = fVar15 + fVar15 + fVar87;
                pfVar51[-0xc] = fVar16 + fVar16 + fVar88;
                pfVar51[-0xb] = fVar17 + fVar17 + fVar89;
                pfVar51[-10] = fVar18 + fVar18 + fVar90;
                pfVar51[-9] = fVar19 + fVar19 + fVar91;
                pfVar51[-8] = fVar92 * 4.0 + fVar72;
                pfVar51[-7] = fVar95 * 4.0 + fVar73;
                pfVar51[-6] = fVar96 * 4.0 + fVar74;
                pfVar51[-5] = fVar97 * 4.0 + fVar75;
                pfVar51[-4] = fVar98 * 4.0 + fVar76;
                pfVar51[-3] = fVar99 * 4.0 + fVar77;
                pfVar51[-2] = fVar100 * 4.0 + fVar78;
                pfVar51[-1] = fVar101 + fVar79;
                *pfVar51 = fVar82 + fVar28 + fVar12 * 8.0;
                pfVar51[1] = fVar85 + fVar29 + fVar13 * 8.0;
                pfVar51[2] = fVar86 + fVar30 + fVar14 * 8.0;
                pfVar51[3] = fVar87 + fVar31 + fVar15 * 8.0;
                pfVar51[4] = fVar88 + fVar32 + fVar16 * 8.0;
                pfVar51[5] = fVar89 + fVar33 + fVar17 * 8.0;
                pfVar51[6] = fVar90 + fVar34 + fVar18 * 8.0;
                pfVar51[7] = fVar91 + fVar35 + fVar19;
                lVar56 = lVar56 + 0xc0;
                pfVar51 = pfVar51 + local_6c0.w * 8;
              } while (lVar56 != 0x3a0);
              uVar50 = uVar50 + 1;
              uVar55 = uVar55 + 8;
              pfVar52 = pfVar52 + 0x20;
            } while (uVar50 != uVar45);
          }
          local_6e0 = local_6e0 + local_660;
          local_6d0._0_8_ = (float *)(local_6d0._0_8_ + lVar54 * 4);
          uVar55 = local_640 + 1;
        } while (local_640 + 1 != local_650);
      }
      lVar48 = lVar48 + 1;
    } while (lVar48 != local_668);
  }
  copy_cut_border(&local_6c0,local_5d8,0,local_6c0.h - local_5d8->h,0,local_6c0.w - local_5d8->w,
                  local_5e0);
  piVar11 = (int *)CONCAT44(local_6c0.refcount._4_4_,local_6c0.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_6c0.allocator == (Allocator *)0x0) {
        if (local_6c0.data != (void *)0x0) {
          free(local_6c0.data);
        }
      }
      else {
        (*(local_6c0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_6c0.cstep = 0;
  auVar61 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
  local_6c0.data = (void *)0x0;
  local_6c0.refcount._0_4_ = 0;
  local_6c0.refcount._4_4_ = 0;
  local_6c0.elemsize._0_4_ = 0;
  local_6c0.elemsize._4_4_ = 0;
  local_6c0.elempack = 0;
  local_6c0.dims = 0;
  local_6c0.w = 0;
  local_6c0.h = 0;
  local_6c0.d = 0;
  local_6c0.c = 0;
  piVar11 = (int *)CONCAT44(fStack_574,fStack_578);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_560 == (Allocator *)0x0) {
        if (local_580 != (undefined1  [8])0x0) {
          free((void *)local_580);
          auVar61 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
        }
      }
      else {
        (*local_560->_vptr_Allocator[3])();
        auVar61 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
      }
    }
  }
  local_540 = 0;
  local_580 = (undefined1  [8])0x0;
  fStack_578 = auVar61._4_4_;
  fStack_574 = 0.0;
  local_570 = auVar61._0_8_;
  afStack_568[0] = auVar61._8_4_;
  iStack_554 = 0;
  uStack_550 = auVar61._4_8_;
  local_548 = 0;
  piVar11 = (int *)CONCAT44(local_5d0.refcount._4_4_,local_5d0.refcount._0_4_);
  iStack_558 = (int)fStack_574;
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_5d0.allocator == (Allocator *)0x0) {
        if (local_5d0.data != (void *)0x0) {
          free(local_5d0.data);
        }
      }
      else {
        (*(local_5d0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_5d0.cstep = 0;
  local_5d0.data = (void *)0x0;
  local_5d0.refcount._0_4_ = 0;
  local_5d0.refcount._4_4_ = 0;
  local_5d0.elemsize._0_4_ = 0;
  local_5d0.elemsize._4_4_ = 0;
  local_5d0.elempack = 0;
  local_5d0.dims = 0;
  local_5d0.w = 0;
  local_5d0.h = 0;
  local_5d0.d = 0;
  local_5d0.c = 0;
  piVar11 = (int *)CONCAT44(local_630.refcount._4_4_,local_630.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_630.allocator == (Allocator *)0x0) {
        if (local_630.data != (void *)0x0) {
          free(local_630.data);
        }
      }
      else {
        (*(local_630.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 4;
        int h_tiles = outh / 4;
        const int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 36, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd43_transform_input_pack8_avx(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack8_avx(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd43_transform_output_pack8_avx(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}